

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

MicroPropsGenerator * __thiscall
icu_63::number::impl::NumberFormatterImpl::macrosToMicroGenerator
          (NumberFormatterImpl *this,MacroProps *macros,bool safe,UErrorCode *status)

{
  CompactStyle compactStyle;
  int16_t iVar1;
  int16_t iVar2;
  undefined2 uVar3;
  UNumberUnitWidth unitWidth_00;
  CurrencySymbols *currencySymbols_00;
  UBool UVar4;
  bool bVar5;
  DecimalFormatSymbols *pDVar6;
  DecimalFormatSymbols *pDVar7;
  char *isoCode;
  ParsedPatternInfo *pPVar8;
  CompactHandler *pCVar9;
  LongNameHandler *p;
  PluralRules *pPVar10;
  bool bVar11;
  Grouper GVar12;
  Padder PVar13;
  IntegerWidth IVar14;
  CompactHandler *local_6d8;
  CompactHandler *local_698;
  bool local_689;
  ParsedPatternInfo *local_5d8;
  CompactHandler *local_5c0;
  ParsedPatternInfo *local_5a0;
  ParsedPatternInfo *local_530;
  DecimalFormatSymbols *local_508;
  DecimalFormatSymbols *local_4e8;
  DecimalFormatSymbols *local_4d0;
  bool local_494;
  byte local_493;
  bool local_492;
  bool local_491;
  CompactType compactType;
  MutablePatternModifier *patternModifier;
  RoundingImpl local_3d0;
  UNumberFormatRoundingMode local_3a4;
  undefined1 auStack_3a0 [4];
  UNumberFormatRoundingMode roundingMode;
  PrecisionUnion local_398;
  UNumberFormatRoundingMode local_388;
  Precision local_380;
  FractionPrecision local_360;
  Precision local_340;
  undefined1 local_320 [8];
  Precision precision;
  ParsedPatternInfo *patternInfo;
  undefined1 local_2a0 [4];
  CldrPatternStyle patternStyle;
  UnicodeString local_260;
  undefined1 local_219;
  DecimalFormatSymbols *local_218;
  DecimalFormatSymbols *local_210;
  DecimalFormatSymbols *symbols;
  CurrencyFormatInfoResult info;
  char16_t *pattern;
  char *nsName;
  NumberingSystem *ns;
  LocalPointer<const_icu_63::NumberingSystem> nsLocal;
  undefined1 local_1b0 [4];
  UNumberUnitWidth unitWidth;
  CurrencySymbols local_190;
  CurrencySymbols *local_a8;
  CurrencySymbols *currencySymbols;
  ConstChar16Ptr local_70;
  undefined1 local_68 [8];
  CurrencyUnit currency;
  bool isAccounting;
  bool isCldrUnit;
  bool isPermille;
  bool isPercent;
  bool isNoUnit;
  CompactHandler *pCStack_40;
  bool isCurrency;
  MicroPropsGenerator *chain;
  UErrorCode *status_local;
  bool safe_local;
  MacroProps *macros_local;
  NumberFormatterImpl *this_local;
  
  UVar4 = ::U_FAILURE(*status);
  if (UVar4 == '\0') {
    pCStack_40 = (CompactHandler *)&this->fMicros;
    bVar5 = MacroProps::copyErrorTo(macros,status);
    if (bVar5) {
      this_local = (NumberFormatterImpl *)0x0;
    }
    else {
      currency._31_1_ = utils::unitIsCurrency(&macros->unit);
      currency._30_1_ = utils::unitIsNoUnit(&macros->unit);
      local_491 = false;
      if ((bool)currency._30_1_) {
        local_491 = utils::unitIsPercent(&macros->unit);
      }
      currency._29_1_ = local_491;
      local_492 = false;
      if ((currency._30_1_ & 1) != 0) {
        local_492 = utils::unitIsPermille(&macros->unit);
      }
      currency._28_1_ = local_492;
      local_493 = 0;
      if ((currency._31_1_ & 1) == 0) {
        local_493 = currency._30_1_ ^ 0xff;
      }
      currency._27_1_ = local_493 & 1;
      local_494 = true;
      if ((macros->sign != UNUM_SIGN_ACCOUNTING) &&
         (local_494 = true, macros->sign != UNUM_SIGN_ACCOUNTING_ALWAYS)) {
        local_494 = macros->sign == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO;
      }
      currency._26_1_ = local_494;
      ConstChar16Ptr::ConstChar16Ptr(&local_70,(nullptr_t)0x0);
      CurrencyUnit::CurrencyUnit((CurrencyUnit *)local_68,&local_70,status);
      ConstChar16Ptr::~ConstChar16Ptr(&local_70);
      if ((currency._31_1_ & 1) != 0) {
        CurrencyUnit::CurrencyUnit((CurrencyUnit *)&currencySymbols,&macros->unit,status);
        CurrencyUnit::operator=((CurrencyUnit *)local_68,(CurrencyUnit *)&currencySymbols);
        CurrencyUnit::~CurrencyUnit((CurrencyUnit *)&currencySymbols);
      }
      if (macros->currencySymbols == (CurrencySymbols *)0x0) {
        CurrencyUnit::CurrencyUnit((CurrencyUnit *)local_1b0,(CurrencyUnit *)local_68);
        CurrencySymbols::CurrencySymbols
                  (&local_190,(CurrencyUnit *)local_1b0,&macros->locale,status);
        CurrencySymbols::operator=(&(this->fWarehouse).fCurrencySymbols,&local_190);
        CurrencySymbols::~CurrencySymbols(&local_190);
        CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_1b0);
        local_a8 = &(this->fWarehouse).fCurrencySymbols;
      }
      else {
        local_a8 = macros->currencySymbols;
      }
      nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_ =
           UNUM_UNIT_WIDTH_SHORT;
      if (macros->unitWidth != UNUM_UNIT_WIDTH_COUNT) {
        nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_ = macros->unitWidth;
      }
      pDVar7 = (DecimalFormatSymbols *)0x0;
      LocalPointer<const_icu_63::NumberingSystem>::LocalPointer
                ((LocalPointer<const_icu_63::NumberingSystem> *)&ns,(NumberingSystem *)0x0);
      bVar5 = SymbolsWrapper::isNumberingSystem(&macros->symbols);
      if (bVar5) {
        nsName = (char *)SymbolsWrapper::getNumberingSystem(&macros->symbols);
      }
      else {
        nsName = (char *)NumberingSystem::createInstance(&macros->locale,status);
        pDVar7 = (DecimalFormatSymbols *)nsName;
        LocalPointer<const_icu_63::NumberingSystem>::adoptInstead
                  ((LocalPointer<const_icu_63::NumberingSystem> *)&ns,(NumberingSystem *)nsName);
      }
      UVar4 = ::U_SUCCESS(*status);
      if (UVar4 == '\0') {
        local_4d0 = (DecimalFormatSymbols *)0x4df346;
      }
      else {
        local_4d0 = (DecimalFormatSymbols *)NumberingSystem::getName((NumberingSystem *)nsName);
      }
      bVar5 = SymbolsWrapper::isDecimalFormatSymbols(&macros->symbols);
      if (bVar5) {
        pDVar6 = SymbolsWrapper::getDecimalFormatSymbols(&macros->symbols);
        (this->fMicros).symbols = pDVar6;
      }
      else {
        pDVar7 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pDVar7);
        local_4e8 = (DecimalFormatSymbols *)0x0;
        if (pDVar7 != (DecimalFormatSymbols *)0x0) {
          DecimalFormatSymbols::DecimalFormatSymbols
                    (pDVar7,&macros->locale,(NumberingSystem *)nsName,status);
          local_4e8 = pDVar7;
        }
        (this->fMicros).symbols = local_4e8;
        pDVar7 = (this->fMicros).symbols;
        LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInstead(&this->fSymbols,pDVar7);
      }
      info.groupingSeparator = (char16_t *)0x0;
      if ((currency._31_1_ & 1) != 0) {
        pDVar7 = (DecimalFormatSymbols *)&macros->locale;
        isoCode = MeasureUnit::getSubtype((MeasureUnit *)local_68);
        anon_unknown.dwarf_156187::getCurrencyFormatInfo
                  ((CurrencyFormatInfoResult *)&symbols,(Locale *)pDVar7,isoCode,status);
        if (((byte)symbols & 1) != 0) {
          info.groupingSeparator = (char16_t *)info._0_8_;
          pDVar7 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pDVar7);
          local_219 = 0;
          local_508 = (DecimalFormatSymbols *)0x0;
          if (pDVar7 != (DecimalFormatSymbols *)0x0) {
            local_219 = 1;
            local_218 = pDVar7;
            DecimalFormatSymbols::DecimalFormatSymbols(pDVar7,(this->fMicros).symbols);
            local_508 = pDVar7;
          }
          local_210 = local_508;
          (this->fMicros).symbols = local_508;
          LocalPointer<const_icu_63::DecimalFormatSymbols>::adoptInstead(&this->fSymbols,local_508);
          pDVar7 = local_210;
          icu_63::UnicodeString::UnicodeString(&local_260,info.pattern);
          DecimalFormatSymbols::setSymbol(pDVar7,kMonetarySeparatorSymbol,&local_260,'\0');
          icu_63::UnicodeString::~UnicodeString(&local_260);
          pDVar6 = local_210;
          icu_63::UnicodeString::UnicodeString((UnicodeString *)local_2a0,info.decimalSeparator);
          pDVar7 = (DecimalFormatSymbols *)0x11;
          DecimalFormatSymbols::setSymbol
                    (pDVar6,kMonetaryGroupingSeparatorSymbol,(UnicodeString *)local_2a0,'\0');
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_2a0);
        }
      }
      if (info.groupingSeparator == (char16_t *)0x0) {
        if (((currency._29_1_ & 1) == 0) && ((currency._28_1_ & 1) == 0)) {
          if (((currency._31_1_ & 1) == 0) ||
             (nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_ ==
              UNUM_UNIT_WIDTH_FULL_NAME)) {
            patternInfo._4_4_ = CLDR_PATTERN_STYLE_DECIMAL;
          }
          else if ((currency._26_1_ & 1) == 0) {
            patternInfo._4_4_ = CLDR_PATTERN_STYLE_CURRENCY;
          }
          else {
            patternInfo._4_4_ = CLDR_PATTERN_STYLE_ACCOUNTING;
          }
        }
        else {
          patternInfo._4_4_ = CLDR_PATTERN_STYLE_PERCENT;
        }
        pDVar7 = local_4d0;
        info.groupingSeparator =
             utils::getPatternForStyle(&macros->locale,(char *)local_4d0,patternInfo._4_4_,status);
      }
      pPVar8 = (ParsedPatternInfo *)UMemory::operator_new((UMemory *)0x1c8,(size_t)pDVar7);
      local_530 = (ParsedPatternInfo *)0x0;
      if (pPVar8 != (ParsedPatternInfo *)0x0) {
        ParsedPatternInfo::ParsedPatternInfo(pPVar8);
        local_530 = pPVar8;
      }
      LocalPointer<const_icu_63::number::impl::ParsedPatternInfo>::adoptInstead
                (&this->fPatternInfo,local_530);
      icu_63::UnicodeString::UnicodeString
                ((UnicodeString *)&precision.fRoundingMode,info.groupingSeparator);
      PatternParser::parseToPatternInfo((UnicodeString *)&precision.fRoundingMode,local_530,status);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&precision.fRoundingMode);
      bVar5 = Scale::isValid(&macros->scale);
      if (bVar5) {
        MultiplierFormatHandler::setAndChain
                  (&(this->fMicros).helpers.multiplier,&macros->scale,
                   (MicroPropsGenerator *)pCStack_40);
        pCStack_40 = (CompactHandler *)&(this->fMicros).helpers.multiplier;
      }
      Precision::Precision((Precision *)local_320);
      bVar5 = Precision::isBogus(&macros->precision);
      if (bVar5) {
        if ((macros->notation).fType == NTN_COMPACT) {
          Precision::integer();
          FractionPrecision::withMinDigits(&local_340,&local_360,2);
          local_320 = (undefined1  [8])local_340._0_8_;
          precision._0_8_ = local_340.fUnion.fracSig;
          precision.fUnion._0_2_ = local_340.fUnion.increment.fMinFrac;
          precision.fUnion._2_2_ = local_340.fUnion.increment.fMaxFrac;
          precision.fUnion._4_2_ = local_340.fUnion._12_2_;
          precision.fUnion._6_2_ = local_340.fUnion._14_2_;
          precision.fUnion._8_4_ = local_340.fRoundingMode;
        }
        else if ((currency._31_1_ & 1) == 0) {
          Precision::maxFraction((FractionPrecision *)auStack_3a0,6);
          local_320 = (undefined1  [8])_auStack_3a0;
          precision._0_8_ = local_398.fracSig;
          precision.fUnion._0_2_ = local_398.increment.fMinFrac;
          precision.fUnion._2_2_ = local_398.increment.fMaxFrac;
          precision.fUnion._4_2_ = local_398._12_2_;
          precision.fUnion._6_2_ = local_398._14_2_;
          precision.fUnion._8_4_ = local_388;
        }
        else {
          Precision::currency((CurrencyPrecision *)&local_380,UCURR_USAGE_STANDARD);
          local_320 = (undefined1  [8])local_380._0_8_;
          precision._0_8_ = local_380.fUnion.fracSig;
          precision.fUnion._0_2_ = local_380.fUnion.increment.fMinFrac;
          precision.fUnion._2_2_ = local_380.fUnion.increment.fMaxFrac;
          precision.fUnion._4_2_ = local_380.fUnion._12_2_;
          precision.fUnion._6_2_ = local_380.fUnion._14_2_;
          precision.fUnion._8_4_ = local_380.fRoundingMode;
        }
      }
      else {
        local_320._0_4_ = (macros->precision).fType;
        local_320._4_4_ = *(undefined4 *)&(macros->precision).field_0x4;
        precision._0_8_ = (macros->precision).fUnion.fracSig;
        precision.fUnion.fracSig =
             *(FractionSignificantSettings *)((long)&(macros->precision).fUnion + 8);
        precision.fUnion._8_4_ = (macros->precision).fRoundingMode;
      }
      if (macros->roundingMode == UNUM_FOUND_HALFEVEN) {
        local_3a4 = precision.fUnion._8_4_;
      }
      else {
        local_3a4 = macros->roundingMode;
      }
      RoundingImpl::RoundingImpl
                (&local_3d0,(Precision *)local_320,local_3a4,(CurrencyUnit *)local_68,status);
      *(ulong *)&(this->fMicros).rounder.fPrecision.field_0x1d =
           CONCAT53(local_3d0._32_5_,local_3d0.fPrecision._29_3_);
      *(undefined8 *)((long)&(this->fMicros).rounder.fPrecision.fUnion + 8) =
           local_3d0.fPrecision.fUnion._8_8_;
      *(ulong *)&(this->fMicros).rounder.fPrecision.fRoundingMode =
           CONCAT35(local_3d0.fPrecision._29_3_,local_3d0.fPrecision._24_5_);
      (this->fMicros).rounder.fPrecision.fType = local_3d0.fPrecision.fType;
      *(undefined4 *)&(this->fMicros).rounder.fPrecision.field_0x4 = local_3d0.fPrecision._4_4_;
      (this->fMicros).rounder.fPrecision.fUnion.fracSig = local_3d0.fPrecision.fUnion.fracSig;
      bVar5 = Grouper::isBogus(&macros->grouper);
      if (bVar5) {
        if ((macros->notation).fType == NTN_COMPACT) {
          GVar12 = Grouper::forStrategy(UNUM_GROUPING_MIN2);
          (this->fMicros).grouping = GVar12;
        }
        else {
          GVar12 = Grouper::forStrategy(UNUM_GROUPING_AUTO);
          (this->fMicros).grouping = GVar12;
        }
      }
      else {
        iVar1 = (macros->grouper).fGrouping2;
        iVar2 = (macros->grouper).fMinGrouping;
        uVar3 = *(undefined2 *)&(macros->grouper).field_0x6;
        (this->fMicros).grouping.fGrouping1 = (macros->grouper).fGrouping1;
        (this->fMicros).grouping.fGrouping2 = iVar1;
        (this->fMicros).grouping.fMinGrouping = iVar2;
        *(undefined2 *)&(this->fMicros).grouping.field_0x6 = uVar3;
        (this->fMicros).grouping.fStrategy = (macros->grouper).fStrategy;
      }
      local_5a0 = LocalPointerBase<const_icu_63::number::impl::ParsedPatternInfo>::operator*
                            (&(this->fPatternInfo).
                              super_LocalPointerBase<const_icu_63::number::impl::ParsedPatternInfo>)
      ;
      Grouper::setLocaleData(&(this->fMicros).grouping,local_5a0,&macros->locale);
      bVar5 = Padder::isBogus(&macros->padder);
      if (bVar5) {
        PVar13 = Padder::none();
        (this->fMicros).padding = PVar13;
      }
      else {
        *(undefined8 *)&(this->fMicros).padding = *(undefined8 *)&macros->padder;
        (this->fMicros).padding.fUnion.padding.fPosition = (macros->padder).fUnion.padding.fPosition
        ;
      }
      bVar5 = IntegerWidth::isBogus(&macros->integerWidth);
      if (bVar5) {
        IVar14 = IntegerWidth::standard();
        (this->fMicros).integerWidth.fUnion = IVar14.fUnion;
        (this->fMicros).integerWidth.fHasError = IVar14.fHasError;
      }
      else {
        (this->fMicros).integerWidth.fUnion = (macros->integerWidth).fUnion;
        (this->fMicros).integerWidth.fHasError = (macros->integerWidth).fHasError;
      }
      if (macros->sign == UNUM_SIGN_COUNT) {
        (this->fMicros).sign = UNUM_SIGN_AUTO;
      }
      else {
        (this->fMicros).sign = macros->sign;
      }
      if (macros->decimal == UNUM_DECIMAL_SEPARATOR_COUNT) {
        (this->fMicros).decimal = UNUM_DECIMAL_SEPARATOR_AUTO;
      }
      else {
        (this->fMicros).decimal = macros->decimal;
      }
      (this->fMicros).useCurrency = (bool)(currency._31_1_ & 1);
      if ((macros->notation).fType == NTN_SCIENTIFIC) {
        pPVar8 = (ParsedPatternInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)local_5a0);
        local_5a0 = (ParsedPatternInfo *)0x0;
        if (pPVar8 != (ParsedPatternInfo *)0x0) {
          ScientificHandler::ScientificHandler
                    ((ScientificHandler *)pPVar8,&macros->notation,(this->fMicros).symbols,
                     &pCStack_40->super_MicroPropsGenerator);
          local_5a0 = pPVar8;
        }
        LocalPointer<const_icu_63::number::impl::ScientificHandler>::adoptInstead
                  (&this->fScientificHandler,(ScientificHandler *)local_5a0);
        pCStack_40 = (CompactHandler *)
                     LocalPointerBase<const_icu_63::number::impl::ScientificHandler>::getAlias
                               (&(this->fScientificHandler).
                                 super_LocalPointerBase<const_icu_63::number::impl::ScientificHandler>
                               );
      }
      else {
        (this->fMicros).modInner = &(this->fMicros).helpers.emptyStrongModifier.super_Modifier;
      }
      pCVar9 = (CompactHandler *)UMemory::operator_new((UMemory *)0xa0,(size_t)local_5a0);
      local_5c0 = (CompactHandler *)0x0;
      if (pCVar9 != (CompactHandler *)0x0) {
        MutablePatternModifier::MutablePatternModifier((MutablePatternModifier *)pCVar9,false);
        local_5c0 = pCVar9;
      }
      LocalPointer<icu_63::number::impl::MutablePatternModifier>::adoptInstead
                (&this->fPatternModifier,(MutablePatternModifier *)local_5c0);
      if (macros->affixProvider == (AffixPatternProvider *)0x0) {
        local_5d8 = LocalPointerBase<const_icu_63::number::impl::ParsedPatternInfo>::getAlias
                              (&(this->fPatternInfo).
                                super_LocalPointerBase<const_icu_63::number::impl::ParsedPatternInfo>
                              );
      }
      else {
        local_5d8 = (ParsedPatternInfo *)macros->affixProvider;
      }
      MutablePatternModifier::setPatternInfo
                ((MutablePatternModifier *)local_5c0,&local_5d8->super_AffixPatternProvider);
      MutablePatternModifier::setPatternAttributes
                ((MutablePatternModifier *)local_5c0,(this->fMicros).sign,
                 (bool)(currency._28_1_ & 1));
      bVar5 = MutablePatternModifier::needsPlurals((MutablePatternModifier *)local_5c0);
      currencySymbols_00 = local_a8;
      unitWidth_00 = nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_;
      if (bVar5) {
        pDVar7 = (this->fMicros).symbols;
        pPVar10 = resolvePluralRules(this,macros->rules,&macros->locale,status);
        MutablePatternModifier::setSymbols
                  ((MutablePatternModifier *)local_5c0,pDVar7,currencySymbols_00,unitWidth_00,
                   pPVar10);
      }
      else {
        MutablePatternModifier::setSymbols
                  ((MutablePatternModifier *)local_5c0,(this->fMicros).symbols,local_a8,
                   nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_,
                   (PluralRules *)0x0);
      }
      if (safe) {
        p = (LongNameHandler *)
            MutablePatternModifier::createImmutableAndChain
                      ((MutablePatternModifier *)local_5c0,&pCStack_40->super_MicroPropsGenerator,
                       status);
        LocalPointer<const_icu_63::number::impl::ImmutablePatternModifier>::adoptInstead
                  (&this->fImmutablePatternModifier,(ImmutablePatternModifier *)p);
        pCStack_40 = (CompactHandler *)
                     LocalPointerBase<const_icu_63::number::impl::ImmutablePatternModifier>::
                     getAlias(&(this->fImmutablePatternModifier).
                               super_LocalPointerBase<const_icu_63::number::impl::ImmutablePatternModifier>
                             );
      }
      else {
        p = (LongNameHandler *)pCStack_40;
        MutablePatternModifier::addToChain
                  ((MutablePatternModifier *)local_5c0,&pCStack_40->super_MicroPropsGenerator);
        pCStack_40 = local_5c0;
      }
      if ((currency._27_1_ & 1) == 0) {
        if (((currency._31_1_ & 1) == 0) ||
           (nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_ !=
            UNUM_UNIT_WIDTH_FULL_NAME)) {
          (this->fMicros).modOuter = &(this->fMicros).helpers.emptyWeakModifier.super_Modifier;
        }
        else {
          pPVar10 = resolvePluralRules(this,macros->rules,&macros->locale,status);
          p = LongNameHandler::forCurrencyLongNames
                        (&macros->locale,(CurrencyUnit *)local_68,pPVar10,
                         &pCStack_40->super_MicroPropsGenerator,status);
          LocalPointer<const_icu_63::number::impl::LongNameHandler>::adoptInstead
                    (&this->fLongNameHandler,p);
          pCStack_40 = (CompactHandler *)
                       LocalPointerBase<const_icu_63::number::impl::LongNameHandler>::getAlias
                                 (&(this->fLongNameHandler).
                                   super_LocalPointerBase<const_icu_63::number::impl::LongNameHandler>
                                 );
        }
      }
      else {
        pPVar10 = resolvePluralRules(this,macros->rules,&macros->locale,status);
        p = LongNameHandler::forMeasureUnit
                      (&macros->locale,&macros->unit,&macros->perUnit,
                       (UNumberUnitWidth *)
                       ((long)&nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr + 4
                       ),pPVar10,&pCStack_40->super_MicroPropsGenerator,status);
        LocalPointer<const_icu_63::number::impl::LongNameHandler>::adoptInstead
                  (&this->fLongNameHandler,p);
        pCStack_40 = (CompactHandler *)
                     LocalPointerBase<const_icu_63::number::impl::LongNameHandler>::getAlias
                               (&(this->fLongNameHandler).
                                 super_LocalPointerBase<const_icu_63::number::impl::LongNameHandler>
                               );
      }
      if ((macros->notation).fType == NTN_COMPACT) {
        bVar5 = (currency._31_1_ & 1) != 0;
        bVar11 = nsLocal.super_LocalPointerBase<const_icu_63::NumberingSystem>.ptr._4_4_ !=
                 UNUM_UNIT_WIDTH_FULL_NAME;
        local_689 = bVar5 && bVar11;
        pCVar9 = (CompactHandler *)
                 UMemory::operator_new((UMemory *)0x5e0,CONCAT71((int7)((ulong)p >> 8),local_689));
        local_698 = (CompactHandler *)0x0;
        if (pCVar9 != (CompactHandler *)0x0) {
          compactStyle = (macros->notation).fUnion.compactStyle;
          pPVar10 = resolvePluralRules(this,macros->rules,&macros->locale,status);
          if (safe) {
            local_6d8 = local_5c0;
          }
          else {
            local_6d8 = (CompactHandler *)0x0;
          }
          CompactHandler::CompactHandler
                    (pCVar9,compactStyle,&macros->locale,(char *)local_4d0,(uint)(bVar5 && bVar11),
                     pPVar10,(MutablePatternModifier *)local_6d8,
                     &pCStack_40->super_MicroPropsGenerator,status);
          local_698 = pCVar9;
        }
        LocalPointer<const_icu_63::number::impl::CompactHandler>::adoptInstead
                  (&this->fCompactHandler,local_698);
        pCStack_40 = LocalPointerBase<const_icu_63::number::impl::CompactHandler>::getAlias
                               (&(this->fCompactHandler).
                                 super_LocalPointerBase<const_icu_63::number::impl::CompactHandler>)
        ;
      }
      this_local = (NumberFormatterImpl *)pCStack_40;
      LocalPointer<const_icu_63::NumberingSystem>::~LocalPointer
                ((LocalPointer<const_icu_63::NumberingSystem> *)&ns);
      CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_68);
    }
  }
  else {
    this_local = (NumberFormatterImpl *)0x0;
  }
  return (MicroPropsGenerator *)this_local;
}

Assistant:

const MicroPropsGenerator*
NumberFormatterImpl::macrosToMicroGenerator(const MacroProps& macros, bool safe, UErrorCode& status) {
    if (U_FAILURE(status)) { return nullptr; }
    const MicroPropsGenerator* chain = &fMicros;

    // Check that macros is error-free before continuing.
    if (macros.copyErrorTo(status)) {
        return nullptr;
    }

    // TODO: Accept currency symbols from DecimalFormatSymbols?

    // Pre-compute a few values for efficiency.
    bool isCurrency = utils::unitIsCurrency(macros.unit);
    bool isNoUnit = utils::unitIsNoUnit(macros.unit);
    bool isPercent = isNoUnit && utils::unitIsPercent(macros.unit);
    bool isPermille = isNoUnit && utils::unitIsPermille(macros.unit);
    bool isCldrUnit = !isCurrency && !isNoUnit;
    bool isAccounting =
            macros.sign == UNUM_SIGN_ACCOUNTING || macros.sign == UNUM_SIGN_ACCOUNTING_ALWAYS ||
            macros.sign == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO;
    CurrencyUnit currency(nullptr, status);
    if (isCurrency) {
        currency = CurrencyUnit(macros.unit, status); // Restore CurrencyUnit from MeasureUnit
    }
    const CurrencySymbols* currencySymbols;
    if (macros.currencySymbols != nullptr) {
        // Used by the DecimalFormat code path
        currencySymbols = macros.currencySymbols;
    } else {
        fWarehouse.fCurrencySymbols = {currency, macros.locale, status};
        currencySymbols = &fWarehouse.fCurrencySymbols;
    }
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_SHORT;
    if (macros.unitWidth != UNUM_UNIT_WIDTH_COUNT) {
        unitWidth = macros.unitWidth;
    }

    // Select the numbering system.
    LocalPointer<const NumberingSystem> nsLocal;
    const NumberingSystem* ns;
    if (macros.symbols.isNumberingSystem()) {
        ns = macros.symbols.getNumberingSystem();
    } else {
        // TODO: Is there a way to avoid creating the NumberingSystem object?
        ns = NumberingSystem::createInstance(macros.locale, status);
        // Give ownership to the function scope.
        nsLocal.adoptInstead(ns);
    }
    const char* nsName = U_SUCCESS(status) ? ns->getName() : "latn";

    // Resolve the symbols. Do this here because currency may need to customize them.
    if (macros.symbols.isDecimalFormatSymbols()) {
        fMicros.symbols = macros.symbols.getDecimalFormatSymbols();
    } else {
        fMicros.symbols = new DecimalFormatSymbols(macros.locale, *ns, status);
        // Give ownership to the NumberFormatterImpl.
        fSymbols.adoptInstead(fMicros.symbols);
    }

    // Load and parse the pattern string. It is used for grouping sizes and affixes only.
    // If we are formatting currency, check for a currency-specific pattern.
    const char16_t* pattern = nullptr;
    if (isCurrency) {
        CurrencyFormatInfoResult info = getCurrencyFormatInfo(
                macros.locale, currency.getSubtype(), status);
        if (info.exists) {
            pattern = info.pattern;
            // It's clunky to clone an object here, but this code is not frequently executed.
            auto* symbols = new DecimalFormatSymbols(*fMicros.symbols);
            fMicros.symbols = symbols;
            fSymbols.adoptInstead(symbols);
            symbols->setSymbol(
                    DecimalFormatSymbols::ENumberFormatSymbol::kMonetarySeparatorSymbol,
                    UnicodeString(info.decimalSeparator),
                    FALSE);
            symbols->setSymbol(
                    DecimalFormatSymbols::ENumberFormatSymbol::kMonetaryGroupingSeparatorSymbol,
                    UnicodeString(info.groupingSeparator),
                    FALSE);
        }
    }
    if (pattern == nullptr) {
        CldrPatternStyle patternStyle;
        if (isPercent || isPermille) {
            patternStyle = CLDR_PATTERN_STYLE_PERCENT;
        } else if (!isCurrency || unitWidth == UNUM_UNIT_WIDTH_FULL_NAME) {
            patternStyle = CLDR_PATTERN_STYLE_DECIMAL;
        } else if (isAccounting) {
            // NOTE: Although ACCOUNTING and ACCOUNTING_ALWAYS are only supported in currencies right now,
            // the API contract allows us to add support to other units in the future.
            patternStyle = CLDR_PATTERN_STYLE_ACCOUNTING;
        } else {
            patternStyle = CLDR_PATTERN_STYLE_CURRENCY;
        }
        pattern = utils::getPatternForStyle(macros.locale, nsName, patternStyle, status);
    }
    auto patternInfo = new ParsedPatternInfo();
    fPatternInfo.adoptInstead(patternInfo);
    PatternParser::parseToPatternInfo(UnicodeString(pattern), *patternInfo, status);

    /////////////////////////////////////////////////////////////////////////////////////
    /// START POPULATING THE DEFAULT MICROPROPS AND BUILDING THE MICROPROPS GENERATOR ///
    /////////////////////////////////////////////////////////////////////////////////////

    // Multiplier
    if (macros.scale.isValid()) {
        fMicros.helpers.multiplier.setAndChain(macros.scale, chain);
        chain = &fMicros.helpers.multiplier;
    }

    // Rounding strategy
    Precision precision;
    if (!macros.precision.isBogus()) {
        precision = macros.precision;
    } else if (macros.notation.fType == Notation::NTN_COMPACT) {
        precision = Precision::integer().withMinDigits(2);
    } else if (isCurrency) {
        precision = Precision::currency(UCURR_USAGE_STANDARD);
    } else {
        precision = Precision::maxFraction(6);
    }
    UNumberFormatRoundingMode roundingMode;
    if (macros.roundingMode != kDefaultMode) {
        roundingMode = macros.roundingMode;
    } else {
        // Temporary until ICU 64
        roundingMode = precision.fRoundingMode;
    }
    fMicros.rounder = {precision, roundingMode, currency, status};

    // Grouping strategy
    if (!macros.grouper.isBogus()) {
        fMicros.grouping = macros.grouper;
    } else if (macros.notation.fType == Notation::NTN_COMPACT) {
        // Compact notation uses minGrouping by default since ICU 59
        fMicros.grouping = Grouper::forStrategy(UNUM_GROUPING_MIN2);
    } else {
        fMicros.grouping = Grouper::forStrategy(UNUM_GROUPING_AUTO);
    }
    fMicros.grouping.setLocaleData(*fPatternInfo, macros.locale);

    // Padding strategy
    if (!macros.padder.isBogus()) {
        fMicros.padding = macros.padder;
    } else {
        fMicros.padding = Padder::none();
    }

    // Integer width
    if (!macros.integerWidth.isBogus()) {
        fMicros.integerWidth = macros.integerWidth;
    } else {
        fMicros.integerWidth = IntegerWidth::standard();
    }

    // Sign display
    if (macros.sign != UNUM_SIGN_COUNT) {
        fMicros.sign = macros.sign;
    } else {
        fMicros.sign = UNUM_SIGN_AUTO;
    }

    // Decimal mark display
    if (macros.decimal != UNUM_DECIMAL_SEPARATOR_COUNT) {
        fMicros.decimal = macros.decimal;
    } else {
        fMicros.decimal = UNUM_DECIMAL_SEPARATOR_AUTO;
    }

    // Use monetary separator symbols
    fMicros.useCurrency = isCurrency;

    // Inner modifier (scientific notation)
    if (macros.notation.fType == Notation::NTN_SCIENTIFIC) {
        fScientificHandler.adoptInstead(new ScientificHandler(&macros.notation, fMicros.symbols, chain));
        chain = fScientificHandler.getAlias();
    } else {
        // No inner modifier required
        fMicros.modInner = &fMicros.helpers.emptyStrongModifier;
    }

    // Middle modifier (patterns, positive/negative, currency symbols, percent)
    auto patternModifier = new MutablePatternModifier(false);
    fPatternModifier.adoptInstead(patternModifier);
    patternModifier->setPatternInfo(
            macros.affixProvider != nullptr ? macros.affixProvider
                                            : static_cast<const AffixPatternProvider*>(fPatternInfo.getAlias()));
    patternModifier->setPatternAttributes(fMicros.sign, isPermille);
    if (patternModifier->needsPlurals()) {
        patternModifier->setSymbols(
                fMicros.symbols,
                currencySymbols,
                unitWidth,
                resolvePluralRules(macros.rules, macros.locale, status));
    } else {
        patternModifier->setSymbols(fMicros.symbols, currencySymbols, unitWidth, nullptr);
    }
    if (safe) {
        fImmutablePatternModifier.adoptInstead(patternModifier->createImmutableAndChain(chain, status));
        chain = fImmutablePatternModifier.getAlias();
    } else {
        patternModifier->addToChain(chain);
        chain = patternModifier;
    }

    // Outer modifier (CLDR units and currency long names)
    if (isCldrUnit) {
        fLongNameHandler.adoptInstead(
                LongNameHandler::forMeasureUnit(
                        macros.locale,
                        macros.unit,
                        macros.perUnit,
                        unitWidth,
                        resolvePluralRules(macros.rules, macros.locale, status),
                        chain,
                        status));
        chain = fLongNameHandler.getAlias();
    } else if (isCurrency && unitWidth == UNUM_UNIT_WIDTH_FULL_NAME) {
        fLongNameHandler.adoptInstead(
                LongNameHandler::forCurrencyLongNames(
                        macros.locale,
                        currency,
                        resolvePluralRules(macros.rules, macros.locale, status),
                        chain,
                        status));
        chain = fLongNameHandler.getAlias();
    } else {
        // No outer modifier required
        fMicros.modOuter = &fMicros.helpers.emptyWeakModifier;
    }

    // Compact notation
    // NOTE: Compact notation can (but might not) override the middle modifier and rounding.
    // It therefore needs to go at the end of the chain.
    if (macros.notation.fType == Notation::NTN_COMPACT) {
        CompactType compactType = (isCurrency && unitWidth != UNUM_UNIT_WIDTH_FULL_NAME)
                                  ? CompactType::TYPE_CURRENCY : CompactType::TYPE_DECIMAL;
        fCompactHandler.adoptInstead(
                new CompactHandler(
                        macros.notation.fUnion.compactStyle,
                        macros.locale,
                        nsName,
                        compactType,
                        resolvePluralRules(macros.rules, macros.locale, status),
                        safe ? patternModifier : nullptr,
                        chain,
                        status));
        chain = fCompactHandler.getAlias();
    }

    return chain;
}